

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

ON_BrepTrim * __thiscall ON_ClassArray<ON_BrepTrim>::AppendNew(ON_ClassArray<ON_BrepTrim> *this)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  
  uVar1 = this->m_count;
  lVar3 = (long)(int)uVar1;
  if (uVar1 == this->m_capacity) {
    if (((int)uVar1 < 8) || ((ulong)(lVar3 * 0xe8) < 0x10000001)) {
      uVar4 = 4;
      if (2 < (int)uVar1) {
        uVar4 = uVar1 * 2;
      }
    }
    else {
      uVar4 = 0x11a7c1;
      if (uVar1 < 0x11a7c1) {
        uVar4 = uVar1;
      }
      uVar4 = uVar4 + uVar1;
    }
    if (uVar1 < uVar4) {
      SetCapacity(this,(long)(int)uVar4);
    }
  }
  else {
    (*this->m_a[lVar3].super_ON_CurveProxy.super_ON_Curve.super_ON_Geometry.super_ON_Object.
      _vptr_ON_Object[3])(this->m_a + lVar3);
    ON_BrepTrim::ON_BrepTrim(this->m_a + this->m_count);
  }
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  return this->m_a + iVar2;
}

Assistant:

T& ON_ClassArray<T>::AppendNew()
{
  if ( m_count == m_capacity ) 
  {
    int newcapacity = NewCapacity();
    Reserve( newcapacity );
  }
  else
  {
    // First destroy what's there ..
    DestroyElement(m_a[m_count]);
    // and then get a properly initialized element
    ConstructDefaultElement(&m_a[m_count]);
  }
  return m_a[m_count++];
}